

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void add_objsymbol(ObjectUnit *ou,Symbol *newsym)

{
  node *pnVar1;
  char *__s1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  node *pnVar5;
  node **ppnVar6;
  
  uVar4 = elf_hash(newsym->name);
  uVar2 = (uint)uVar4 & 0x1f;
  pnVar1 = (&(ou->n).next)[uVar2];
  if (pnVar1 == (node *)0x0) {
    ppnVar6 = &(ou->n).next + uVar2;
  }
  else {
    do {
      pnVar5 = pnVar1;
      __s1 = newsym->name;
      iVar3 = strcmp(__s1,(char *)pnVar5[2].next);
      if (iVar3 == 0) {
        ierror("add_objsymbol(): %s defined twice",__s1);
      }
      pnVar1 = pnVar5[1].pred;
    } while (pnVar5[1].pred != (node *)0x0);
    ppnVar6 = &pnVar5[1].pred;
  }
  *ppnVar6 = &newsym->n;
  return;
}

Assistant:

static void add_objsymbol(struct ObjectUnit *ou,struct Symbol *newsym)
/* Add a symbol to an object unit's symbol table. The symbol name
   must be unique within the object, otherwise an internal error
   will occur! */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(newsym->name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(newsym->name,sym->name))
      ierror("add_objsymbol(): %s defined twice",newsym->name);
    chain = &sym->obj_chain;
  }
  *chain = newsym;
}